

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

pair<int,_int> __thiscall Imf_3_4::DeepScanLineInputFile::Data::getChunkRange(Data *this,int y)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ArgExc *pAVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  exr_attr_box2i_t eVar10;
  int32_t scansperchunk;
  stringstream _iex_throw_s;
  int local_1bc;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar7 = (ulong)(uint)y;
  eVar10 = Context::dataWindow(this->_ctxt,this->partNumber);
  local_1bc = 1;
  if ((eVar10.min.y <= y) && (y <= eVar10.max.y)) {
    iVar1 = exr_get_scanlines_per_chunk
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,&local_1bc);
    if (iVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Error querying scanline counts from image file \"",0x30);
      pcVar2 = Context::fileName(this->_ctxt);
      poVar3 = std::operator<<(local_1a8,pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,local_1b8);
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    lVar5 = (long)local_1bc;
    uVar9 = uVar7;
    if (lVar5 != 1) {
      lVar8 = (long)eVar10.min >> 0x20;
      lVar6 = y - lVar8;
      uVar7 = (lVar6 - lVar6 % lVar5) + lVar8;
      uVar9 = (long)eVar10.max >> 0x20;
      if ((long)(uVar7 + lVar5) <= (long)uVar9) {
        uVar9 = uVar7 + lVar5;
      }
    }
    return (pair<int,_int>)(uVar7 & 0xffffffff | uVar9 << 0x20);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Requested scanline ",0x13);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,y);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," is outside the image file\'s data window: ",0x2a);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,eVar10.min.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
  std::ostream::operator<<((ostream *)poVar3,eVar10.max.y);
  pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar4,local_1b8);
  __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

std::pair<int, int> DeepScanLineInputFile::Data::getChunkRange (int y) const
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    int32_t scansperchunk = 1;

    if (y < dw.min.y || y > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Requested scanline " << y << " is outside "
            "the image file's data window: "
            << dw.min.y << " - " << dw.max.y);
    }

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scansperchunk == 1)
        return std::make_pair( y, y );

    std::pair<int, int> ret;
    int64_t yoff;

    yoff = (int64_t) y;
    yoff -= (int64_t) dw.min.y;
    yoff /= (int64_t) scansperchunk;

    yoff *= (int64_t) scansperchunk;
    yoff += (int64_t) dw.min.y;

    ret.first = (int32_t) yoff;
    yoff += (int64_t) scansperchunk;
    yoff = std::min (yoff, (int64_t) dw.max.y);
    ret.second = (int32_t) yoff;

    return ret;
}